

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_e8615::CommandLineParser::ResetAllOptionOccurrences(CommandLineParser *this)

{
  uint *puVar1;
  long *plVar2;
  void **ppvVar3;
  void **ppvVar4;
  long *plVar5;
  uint *puVar6;
  ulong uVar7;
  long lVar8;
  uint *puVar9;
  iterator __begin1;
  SmallPtrSetIteratorImpl local_48;
  SmallPtrSetIteratorImpl local_38;
  
  local_38.Bucket =
       (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
       super_SmallPtrSetImplBase.CurArray;
  puVar1 = &(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
            super_SmallPtrSetImplBase.NumNonEmpty;
  puVar9 = &(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
            super_SmallPtrSetImplBase.CurArraySize;
  puVar6 = puVar9;
  if (local_38.Bucket ==
      (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
      super_SmallPtrSetImplBase.SmallArray) {
    puVar6 = puVar1;
  }
  local_38.End = local_38.Bucket + *puVar6;
  llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_38);
  ppvVar3 = local_38.Bucket;
  local_48.Bucket = local_38.Bucket;
  local_48.End = local_38.End;
  local_38.Bucket =
       (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
       super_SmallPtrSetImplBase.CurArray;
  if (local_38.Bucket ==
      (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
      super_SmallPtrSetImplBase.SmallArray) {
    puVar9 = puVar1;
  }
  local_38.Bucket = local_38.Bucket + *puVar9;
  local_38.End = local_38.Bucket;
  llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_38);
  ppvVar4 = local_38.Bucket;
  while( true ) {
    if (ppvVar3 == ppvVar4) {
      return;
    }
    if (local_48.End <= ppvVar3) break;
    plVar2 = *(long **)((long)*ppvVar3 + 0x80);
    uVar7 = (ulong)*(uint *)((long)*ppvVar3 + 0x88);
    plVar5 = plVar2;
    if (uVar7 != 0) {
      for (; (*plVar5 == 0 || (*plVar5 == -8)); plVar5 = plVar5 + 1) {
      }
    }
    if (plVar5 != plVar2 + uVar7) {
      lVar8 = *plVar5;
      do {
        *(undefined4 *)(*(long *)(lVar8 + 8) + 8) = 0;
        do {
          do {
            plVar5 = plVar5 + 1;
            lVar8 = *plVar5;
          } while (lVar8 == 0);
        } while (lVar8 == -8);
      } while (plVar5 != plVar2 + uVar7);
    }
    local_48.Bucket = ppvVar3 + 1;
    llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
    ppvVar3 = local_48.Bucket;
  }
  __assert_fail("Bucket < End",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                ,0x122,
                "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
               );
}

Assistant:

void CommandLineParser::ResetAllOptionOccurrences() {
  // So that we can parse different command lines multiple times in succession
  // we reset all option values to look like they have never been seen before.
  for (auto SC : RegisteredSubCommands) {
    for (auto &O : SC->OptionsMap)
      O.second->reset();
  }
}